

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

AssertionExpr * slang::ast::bindUnknownPortConn(ASTContext *context,PropertyExprSyntax *syntax)

{
  Type *args_1;
  Symbol *args;
  bool bVar1;
  int iVar2;
  SimplePropertyExprSyntax *pSVar3;
  SyntaxNode *pSVar4;
  SimpleSequenceExprSyntax *pSVar5;
  not_null<slang::syntax::ExpressionSyntax_*> *this;
  ParenthesizedExpressionSyntax *pPVar6;
  Lookup *this_00;
  Compilation *this_01;
  HierarchicalReferenceExpression *args_00;
  undefined4 extraout_var;
  LookupResult *in_R8;
  SimpleAssertionExpr *unaff_R12;
  Symbol *symbol;
  LookupResult result;
  SourceRange local_228;
  LookupResult local_218;
  
  if ((syntax->super_SyntaxNode).kind == SimplePropertyExpr) {
    pSVar3 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePropertyExprSyntax>
                       (&syntax->super_SyntaxNode);
    pSVar4 = &not_null<slang::syntax::SequenceExprSyntax_*>::get(&pSVar3->expr)->super_SyntaxNode;
    if ((pSVar4->kind == SimpleSequenceExpr) &&
       (pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleSequenceExprSyntax>(pSVar4),
       pSVar5->repetition == (SequenceRepetitionSyntax *)0x0)) {
      this = &pSVar5->expr;
      while( true ) {
        pSVar4 = &not_null<slang::syntax::ExpressionSyntax_*>::get(this)->super_SyntaxNode;
        if (pSVar4->kind != ParenthesizedExpression) break;
        pPVar6 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(pSVar4)
        ;
        this = &pPVar6->expression;
      }
      bVar1 = slang::syntax::NameSyntax::isKind(pSVar4->kind);
      if (bVar1) {
        local_218.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .data_ = (pointer)local_218.selectors.
                          super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                          .firstElement;
        local_218.found = (Symbol *)0x0;
        local_218.systemSubroutine._0_5_ = 0;
        local_218.systemSubroutine._5_3_ = 0;
        local_218.wasImported = false;
        local_218.isHierarchical = false;
        local_218.suppressUndeclared = false;
        local_218.fromTypeParam = false;
        local_218.fromForwardTypedef = false;
        local_218.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .len = 0;
        local_218.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .cap = 4;
        local_218.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.data_ =
             (pointer)local_218.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
        local_218.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.len = 0;
        local_218.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.cap = 2;
        this_00 = (Lookup *)slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(pSVar4);
        Lookup::name(this_00,(NameSyntax *)context,(ASTContext *)0x0,
                     (bitmask<slang::ast::LookupFlags>)(underlying_type)&local_218,in_R8);
        args = local_218.found;
        bVar1 = true;
        if (((local_218.found != (Symbol *)0x0) && ((ulong)(local_218.found)->kind < 0x30)) &&
           ((0xa60000000000U >> ((ulong)(local_218.found)->kind & 0x3f) & 1) != 0)) {
          this_01 = ASTContext::getCompilation(context);
          args_1 = this_01->voidType;
          local_228 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
          args_00 = BumpAllocator::
                    emplace<slang::ast::HierarchicalReferenceExpression,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::SourceRange>
                              (&this_01->super_BumpAllocator,args,args_1,&local_228);
          unaff_R12 = BumpAllocator::
                      emplace<slang::ast::SimpleAssertionExpr,slang::ast::HierarchicalReferenceExpression&,std::nullopt_t_const&>
                                (&this_01->super_BumpAllocator,args_00,(nullopt_t *)&std::nullopt);
          bVar1 = false;
        }
        LookupResult::~LookupResult(&local_218);
        if (!bVar1) {
          return &unaff_R12->super_AssertionExpr;
        }
      }
    }
  }
  iVar2 = AssertionExpr::bind((AssertionExpr *)syntax,(int)context,(sockaddr *)0x0,0);
  return (AssertionExpr *)CONCAT44(extraout_var,iVar2);
}

Assistant:

static const AssertionExpr* bindUnknownPortConn(const ASTContext& context,
                                                const PropertyExprSyntax& syntax) {
    // We have to check for a simple reference to an interface instance or port here,
    // since we don't know whether this is an interface port connection or even
    // a normal connection with a virtual interface type.
    const SyntaxNode* node = &syntax;
    if (node->kind == SyntaxKind::SimplePropertyExpr) {
        node = node->as<SimplePropertyExprSyntax>().expr;
        if (node->kind == SyntaxKind::SimpleSequenceExpr) {
            auto& simpSeq = node->as<SimpleSequenceExprSyntax>();
            if (!simpSeq.repetition) {
                const ExpressionSyntax* expr = simpSeq.expr;
                while (expr->kind == SyntaxKind::ParenthesizedExpression)
                    expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                if (NameSyntax::isKind(expr->kind)) {
                    LookupResult result;
                    Lookup::name(expr->as<NameSyntax>(), context, LookupFlags::None, result);
                    if (result.found) {
                        auto symbol = result.found;
                        if (symbol->kind == SymbolKind::Modport ||
                            symbol->kind == SymbolKind::InterfacePort ||
                            symbol->kind == SymbolKind::Instance ||
                            symbol->kind == SymbolKind::InstanceArray) {
                            auto& comp = context.getCompilation();
                            auto hre = comp.emplace<HierarchicalReferenceExpression>(
                                *symbol, comp.getVoidType(), syntax.sourceRange());
                            return comp.emplace<SimpleAssertionExpr>(*hre, std::nullopt);
                        }
                    }
                }
            }
        }
    }

    return &AssertionExpr::bind(syntax, context);
}